

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_open_file_cache.c
# Opt level: O1

ngx_int_t ngx_open_cached_file
                    (ngx_open_file_cache_t *cache,ngx_str_t *name,ngx_open_file_info_t *of,
                    ngx_pool_t *pool)

{
  long lVar1;
  ngx_fd_t *pnVar2;
  ngx_cached_open_file_t *pnVar3;
  ngx_queue_t *pnVar4;
  ngx_log_t *pnVar5;
  undefined8 *puVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  ngx_pool_cleanup_t *pnVar13;
  long lVar14;
  ngx_int_t nVar15;
  ngx_cached_open_file_t *file;
  u_char *puVar16;
  int *piVar17;
  size_t sVar18;
  __dev_t _Var19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 local_e8 [8];
  ngx_file_info_t fi;
  
  of->fd = -1;
  of->err = 0;
  if (cache == (ngx_open_file_cache_t *)0x0) {
    if ((of->field_0x60 & 8) == 0) {
      pnVar13 = ngx_pool_cleanup_add(pool,0x18);
      if (pnVar13 != (ngx_pool_cleanup_t *)0x0) {
        nVar15 = ngx_open_and_stat_file(name,of,pool->log);
        if (nVar15 != 0) {
          return nVar15;
        }
        if ((of->field_0x60 & 0x80) != 0) {
          return 0;
        }
        pnVar13->handler = ngx_pool_cleanup_file;
        pnVar2 = (ngx_fd_t *)pnVar13->data;
        *pnVar2 = of->fd;
        *(u_char **)(pnVar2 + 2) = name->data;
        *(ngx_log_t **)(pnVar2 + 4) = pool->log;
        return 0;
      }
    }
    else {
      nVar15 = ngx_file_info_wrapper(name,of,(ngx_file_info_t *)local_e8,pool->log);
      if (nVar15 != -1) {
        of->uniq = fi.st_dev;
        of->mtime = fi.st_atim.tv_nsec;
        of->size = fi.st_rdev;
        _Var19 = fi.st_blksize * 0x200;
        if (fi.st_blksize * 0x200 < (long)fi.st_rdev) {
          _Var19 = fi.st_rdev;
        }
        of->fs_size = _Var19;
        uVar28 = (uint)fi.st_nlink & 0xf000;
        *(ushort *)&of->field_0x60 =
             (ushort)(((uint)fi.st_nlink & 0x40) << 4) |
             (ushort)(uVar28 == 0xa000) << 9 | (ushort)(uVar28 == 0x8000) << 8 |
             (ushort)*(undefined4 *)&of->field_0x60 & 0xf87f | (ushort)(uVar28 == 0x4000) << 7;
        goto LAB_0012b8a2;
      }
    }
    nVar15 = -1;
  }
  else {
    fi.__glibc_reserved[2] = (__syscall_slong_t)ngx_pool_cleanup_add(pool,0x20);
    if ((ngx_pool_cleanup_t *)fi.__glibc_reserved[2] == (ngx_pool_cleanup_t *)0x0) {
      return -1;
    }
    lVar1 = ngx_cached_time->sec;
    puVar16 = name->data;
    if (name->len == 0) {
      uVar29 = 0;
    }
    else {
      uVar28 = 0xffffffff;
      sVar18 = 0;
      do {
        uVar28 = uVar28 >> 8 ^ ngx_crc32_table256[(byte)(puVar16[sVar18] ^ (byte)uVar28)];
        sVar18 = sVar18 + 1;
      } while (name->len != sVar18);
      uVar29 = (ulong)~uVar28;
    }
    pnVar3 = (ngx_cached_open_file_t *)(cache->rbtree).sentinel;
    for (file = (ngx_cached_open_file_t *)(cache->rbtree).root; file != pnVar3;
        file = *(ngx_cached_open_file_t **)((long)&(file->node).key + lVar14)) {
      lVar14 = 8;
      uVar21 = (file->node).key;
      if ((uVar21 <= uVar29) && (lVar14 = 0x10, uVar29 <= uVar21)) {
        uVar28 = strcmp((char *)puVar16,(char *)file->name);
        if (uVar28 == 0) goto LAB_0012b232;
        lVar14 = (ulong)(~uVar28 >> 0x1f) * 8 + 8;
      }
    }
    file = (ngx_cached_open_file_t *)0x0;
LAB_0012b232:
    if (file == (ngx_cached_open_file_t *)0x0) {
      nVar15 = ngx_open_and_stat_file(name,of,pool->log);
      if ((nVar15 == 0) || ((of->err != 0 && ((of->field_0x60 & 0x20) != 0)))) {
LAB_0012b3af:
        if (cache->max <= cache->current) {
          ngx_expire_old_cached_files(cache,0,pool->log);
        }
        file = (ngx_cached_open_file_t *)ngx_alloc(0x90,pool->log);
        if (file != (ngx_cached_open_file_t *)0x0) {
          puVar16 = (u_char *)ngx_alloc(name->len + 1,pool->log);
          file->name = puVar16;
          if (puVar16 == (u_char *)0x0) {
            free(file);
            file = (ngx_cached_open_file_t *)0x0;
            goto LAB_0012b473;
          }
          ngx_cpystrn(puVar16,name->data,name->len + 1);
          (file->node).key = uVar29;
          ngx_rbtree_insert(&cache->rbtree,(ngx_rbtree_node_t *)file);
          cache->current = cache->current + 1;
          file->uses = 1;
          *(uint *)&file->field_0x80 = *(uint *)&file->field_0x80 & 0xf4000003;
          file->event = (ngx_event_t *)0x0;
          goto LAB_0012b44c;
        }
      }
      file = (ngx_cached_open_file_t *)0x0;
LAB_0012b473:
      if (file != (ngx_cached_open_file_t *)0x0) {
        ngx_rbtree_delete(&cache->rbtree,&file->node);
        cache->current = cache->current - 1;
        if ((*(ulong *)&file->field_0x80 & 0x3fffffc) == 0) {
          if (((file->fd != -1) && (iVar12 = close(file->fd), iVar12 == -1)) &&
             (pnVar5 = pool->log, 1 < pnVar5->log_level)) {
            piVar17 = __errno_location();
            ngx_log_error_core(2,pnVar5,*piVar17,"close() \"%s\" failed",file->name);
          }
          free(file->name);
          free(file);
        }
        else {
          *(ulong *)&file->field_0x80 = *(ulong *)&file->field_0x80 | 0x4000000;
        }
      }
      if (of->fd == -1) {
        return -1;
      }
      iVar12 = close(of->fd);
      if (iVar12 != -1) {
        return -1;
      }
      pnVar5 = pool->log;
      if (pnVar5->log_level < 2) {
        return -1;
      }
      piVar17 = __errno_location();
      ngx_log_error_core(2,pnVar5,*piVar17,"close() \"%V\" failed",name);
      return -1;
    }
    file->uses = file->uses + 1;
    pnVar4 = (file->queue).next;
    pnVar4->prev = (file->queue).prev;
    ((file->queue).prev)->next = pnVar4;
    (file->queue).prev = (ngx_queue_t *)0x0;
    (file->queue).next = (ngx_queue_t *)0x0;
    uVar28 = file->fd;
    if ((uVar28 == 0xffffffff) && ((file->err == 0 && ((file->field_0x83 & 0x10) == 0)))) {
      nVar15 = ngx_open_and_stat_file(name,of,pool->log);
      if ((nVar15 != 0) && ((of->err == 0 || ((of->field_0x60 & 0x20) == 0)))) goto LAB_0012b473;
LAB_0012b44c:
      ngx_open_file_add_event(cache,file,of,pool->log);
LAB_0012b6ca:
      file->fd = of->fd;
      file->err = of->err;
      uVar29 = *(ulong *)&file->field_0x80;
      uVar21 = (ulong)(*(ushort *)&of->field_0x60 & 3);
      *(ulong *)&file->field_0x80 = uVar29 & 0xfffffffffffffffc | uVar21;
      file->disable_symlinks_from = of->disable_symlinks_from;
      if (of->err == 0) {
        file->uniq = of->uniq;
        file->mtime = of->mtime;
        file->size = of->size;
        *(ulong *)&file->field_0x80 = uVar29 & 0xfffffffffbfffffc | uVar21;
        uVar22 = (ulong)((*(ushort *)&of->field_0x60 & 0x80) << 0x15);
        *(ulong *)&file->field_0x80 = uVar29 & 0xffffffffebfffffc | uVar21 | uVar22;
        uVar23 = (ulong)(((byte)of->field_0x61 & 1) << 0x1d);
        *(ulong *)&file->field_0x80 = uVar29 & 0xffffffffcbfffffc | uVar21 | uVar22 | uVar23;
        uVar24 = (ulong)((*(ushort *)&of->field_0x60 & 0x200) << 0x15);
        *(ulong *)&file->field_0x80 =
             uVar29 & 0xffffffff8bfffffc | uVar21 | uVar22 | uVar23 | uVar24;
        uVar25 = (ulong)((*(ushort *)&of->field_0x60 & 0x400) << 0x15);
        *(ulong *)&file->field_0x80 =
             uVar29 & 0xffffffff0bfffffc | uVar21 | uVar22 | uVar23 | uVar24 | uVar25;
        uVar26 = (ulong)(*(ushort *)&of->field_0x60 >> 0xb & 1) << 0x20;
        *(ulong *)&file->field_0x80 =
             uVar29 & 0xfffffffe0bfffffc | uVar21 | uVar22 | uVar23 | uVar24 | uVar25 | uVar26;
        if ((of->field_0x60 & 0x80) == 0) {
          *(ulong *)&file->field_0x80 =
               uVar29 & 0xfffffffe08000000 | uVar21 | uVar22 | uVar23 | uVar24 | uVar25 | uVar26 |
               (ulong)((int)uVar29 + 4U & 0x3fffffc);
        }
      }
      file->created = lVar1;
    }
    else {
      uVar27 = (uint)*(ulong *)&file->field_0x80;
      if (((uVar27 >> 0x1b & 1) == 0) &&
         (((file->event != (ngx_event_t *)0x0 ||
           (((of->uniq != 0 && (of->uniq != file->uniq)) || (of->valid <= lVar1 - file->created))))
          || (((uVar27 & 3) != (*(ushort *)&of->field_0x60 & 3) ||
              (of->disable_symlinks_from != file->disable_symlinks_from)))))) {
        if ((pool->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,pool->log,0,"retest open file: %s, fd:%d, c:%d, e:%d",file->name,
                             (ulong)uVar28,
                             (ulong)((uint)(*(ulong *)&file->field_0x80 >> 2) & 0xffffff),
                             (ulong)(uint)file->err);
        }
        if ((file->field_0x83 & 0x10) != 0) {
          of->field_0x60 = of->field_0x60 | 4;
        }
        of->fd = file->fd;
        of->uniq = file->uniq;
        nVar15 = ngx_open_and_stat_file(name,of,pool->log);
        if ((nVar15 != 0) && ((of->err == 0 || ((of->field_0x60 & 0x20) == 0)))) goto LAB_0012b473;
        if ((of->field_0x60 & 0x80) == 0) {
          if (of->err == 0) {
            if ((((uint)*(ulong *)&file->field_0x80 >> 0x1c & 1) != 0) || (file->err != 0))
            goto LAB_0012b44c;
            if (of->uniq != file->uniq) goto LAB_0012b92e;
            if (file->event != (ngx_event_t *)0x0) {
              *(ulong *)&file->field_0x80 = *(ulong *)&file->field_0x80 | 0x8000000;
            }
            *(ushort *)&of->field_0x60 =
                 (ushort)*(undefined4 *)&of->field_0x60 & 0xf7ff |
                 (ushort)(*(ulong *)&file->field_0x80 >> 0x15) & 0x800;
          }
          else if ((file->err == 0) && ((file->field_0x83 & 0x10) == 0)) goto LAB_0012b92e;
        }
        else if (((file->field_0x83 & 0x10) == 0) && (file->err == 0)) {
LAB_0012b92e:
          if ((*(uint *)&file->field_0x80 & 0x3fffffc) != 0) {
            ngx_rbtree_delete(&cache->rbtree,&file->node);
            cache->current = cache->current - 1;
            file->field_0x83 = file->field_0x83 | 4;
            goto LAB_0012b3af;
          }
          ngx_open_file_del_event(file);
          iVar12 = close(file->fd);
          if ((iVar12 == -1) && (pnVar5 = pool->log, 1 < pnVar5->log_level)) {
            piVar17 = __errno_location();
            ngx_log_error_core(2,pnVar5,*piVar17,"close() \"%V\" failed",name);
          }
          goto LAB_0012b44c;
        }
        goto LAB_0012b6ca;
      }
      if (file->err == 0) {
        of->fd = uVar28;
        of->uniq = file->uniq;
        of->mtime = file->mtime;
        of->size = file->size;
        uVar7 = (ushort)((uint)*(undefined4 *)&file->field_0x80 >> 0x15) & 0x80;
        uVar11 = (ushort)*(undefined4 *)&of->field_0x60;
        *(ushort *)&of->field_0x60 = uVar11 & 0xff7f | uVar7;
        uVar8 = (ushort)((uint)*(undefined4 *)&file->field_0x80 >> 0x15) & 0x100;
        *(ushort *)&of->field_0x60 = uVar11 & 0xfe7f | uVar7 | uVar8;
        uVar9 = (ushort)((uint)*(undefined4 *)&file->field_0x80 >> 0x15) & 0x200;
        *(ushort *)&of->field_0x60 = uVar11 & 0xfc7f | uVar7 | uVar8 | uVar9;
        uVar10 = (ushort)((uint)*(undefined4 *)&file->field_0x80 >> 0x15) & 0x400;
        *(ushort *)&of->field_0x60 = uVar11 & 0xf87f | uVar7 | uVar8 | uVar9 | uVar10;
        *(ushort *)&of->field_0x60 =
             uVar11 & 0xf07f | uVar7 | uVar8 | uVar9 | uVar10 |
             (ushort)(*(ulong *)&file->field_0x80 >> 0x15) & 0x800;
        uVar28 = (uint)*(ulong *)&file->field_0x80;
        if ((uVar28 >> 0x1c & 1) == 0) {
          *(ulong *)&file->field_0x80 =
               *(ulong *)&file->field_0x80 & 0xffffffffec000003 | (ulong)(uVar28 + 4 & 0x3fffffc);
          ngx_open_file_add_event(cache,file,of,pool->log);
        }
      }
      else {
        of->err = file->err;
        pcVar20 = "openat()";
        if ((file->field_0x80 & 3) == 0) {
          pcVar20 = "open()";
        }
        of->failed = pcVar20;
      }
    }
    file->accessed = lVar1;
    pnVar4 = (cache->expire_queue).next;
    (file->queue).next = pnVar4;
    pnVar4->prev = &file->queue;
    (file->queue).prev = &cache->expire_queue;
    (cache->expire_queue).next = &file->queue;
    if ((pool->log->log_level & 0x10) != 0) {
      ngx_log_error_core(8,pool->log,0,"cached open file: %s, fd:%d, c:%d, e:%d, u:%d",file->name,
                         (ulong)(uint)file->fd,(ulong)(*(uint *)&file->field_0x80 >> 2 & 0xffffff),
                         (ulong)(uint)file->err,(ulong)file->uses);
    }
    if (of->err != 0) {
      return -1;
    }
    if ((of->field_0x60 & 0x80) == 0) {
      *(code **)fi.__glibc_reserved[2] = ngx_open_file_cleanup;
      puVar6 = *(undefined8 **)(fi.__glibc_reserved[2] + 8);
      *puVar6 = cache;
      puVar6[1] = file;
      puVar6[2] = of->min_uses;
      puVar6[3] = pool->log;
    }
LAB_0012b8a2:
    nVar15 = 0;
  }
  return nVar15;
}

Assistant:

ngx_int_t
ngx_open_cached_file(ngx_open_file_cache_t *cache, ngx_str_t *name,
    ngx_open_file_info_t *of, ngx_pool_t *pool)
{
    time_t                          now;
    uint32_t                        hash;
    ngx_int_t                       rc;
    ngx_file_info_t                 fi;
    ngx_pool_cleanup_t             *cln;
    ngx_cached_open_file_t         *file;
    ngx_pool_cleanup_file_t        *clnf;
    ngx_open_file_cache_cleanup_t  *ofcln;

    of->fd = NGX_INVALID_FILE;
    of->err = 0;

    if (cache == NULL) {

        if (of->test_only) {

            if (ngx_file_info_wrapper(name, of, &fi, pool->log)
                == NGX_FILE_ERROR)
            {
                return NGX_ERROR;
            }

            of->uniq = ngx_file_uniq(&fi);
            of->mtime = ngx_file_mtime(&fi);
            of->size = ngx_file_size(&fi);
            of->fs_size = ngx_file_fs_size(&fi);
            of->is_dir = ngx_is_dir(&fi);
            of->is_file = ngx_is_file(&fi);
            of->is_link = ngx_is_link(&fi);
            of->is_exec = ngx_is_exec(&fi);

            return NGX_OK;
        }

        cln = ngx_pool_cleanup_add(pool, sizeof(ngx_pool_cleanup_file_t));
        if (cln == NULL) {
            return NGX_ERROR;
        }

        rc = ngx_open_and_stat_file(name, of, pool->log);

        if (rc == NGX_OK && !of->is_dir) {
            cln->handler = ngx_pool_cleanup_file;
            clnf = cln->data;

            clnf->fd = of->fd;
            clnf->name = name->data;
            clnf->log = pool->log;
        }

        return rc;
    }

    cln = ngx_pool_cleanup_add(pool, sizeof(ngx_open_file_cache_cleanup_t));
    if (cln == NULL) {
        return NGX_ERROR;
    }

    now = ngx_time();

    hash = ngx_crc32_long(name->data, name->len);

    file = ngx_open_file_lookup(cache, name, hash);

    if (file) {

        file->uses++;

        ngx_queue_remove(&file->queue);

        if (file->fd == NGX_INVALID_FILE && file->err == 0 && !file->is_dir) {

            /* file was not used often enough to keep open */

            rc = ngx_open_and_stat_file(name, of, pool->log);

            if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
                goto failed;
            }

            goto add_event;
        }

        if (file->use_event
            || (file->event == NULL
                && (of->uniq == 0 || of->uniq == file->uniq)
                && now - file->created < of->valid
#if (NGX_HAVE_OPENAT)
                && of->disable_symlinks == file->disable_symlinks
                && of->disable_symlinks_from == file->disable_symlinks_from
#endif
            ))
        {
            if (file->err == 0) {

                of->fd = file->fd;
                of->uniq = file->uniq;
                of->mtime = file->mtime;
                of->size = file->size;

                of->is_dir = file->is_dir;
                of->is_file = file->is_file;
                of->is_link = file->is_link;
                of->is_exec = file->is_exec;
                of->is_directio = file->is_directio;

                if (!file->is_dir) {
                    file->count++;
                    ngx_open_file_add_event(cache, file, of, pool->log);
                }

            } else {
                of->err = file->err;
#if (NGX_HAVE_OPENAT)
                of->failed = file->disable_symlinks ? ngx_openat_file_n
                                                    : ngx_open_file_n;
#else
                of->failed = ngx_open_file_n;
#endif
            }

            goto found;
        }

        ngx_log_debug4(NGX_LOG_DEBUG_CORE, pool->log, 0,
                       "retest open file: %s, fd:%d, c:%d, e:%d",
                       file->name, file->fd, file->count, file->err);

        if (file->is_dir) {

            /*
             * chances that directory became file are very small
             * so test_dir flag allows to use a single syscall
             * in ngx_file_info() instead of three syscalls
             */

            of->test_dir = 1;
        }

        of->fd = file->fd;
        of->uniq = file->uniq;

        rc = ngx_open_and_stat_file(name, of, pool->log);

        if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
            goto failed;
        }

        if (of->is_dir) {

            if (file->is_dir || file->err) {
                goto update;
            }

            /* file became directory */

        } else if (of->err == 0) {  /* file */

            if (file->is_dir || file->err) {
                goto add_event;
            }

            if (of->uniq == file->uniq) {

                if (file->event) {
                    file->use_event = 1;
                }

                of->is_directio = file->is_directio;

                goto update;
            }

            /* file was changed */

        } else { /* error to cache */

            if (file->err || file->is_dir) {
                goto update;
            }

            /* file was removed, etc. */
        }

        if (file->count == 0) {

            ngx_open_file_del_event(file);

            if (ngx_close_file(file->fd) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                              ngx_close_file_n " \"%V\" failed", name);
            }

            goto add_event;
        }

        ngx_rbtree_delete(&cache->rbtree, &file->node);

        cache->current--;

        file->close = 1;

        goto create;
    }

    /* not found */

    rc = ngx_open_and_stat_file(name, of, pool->log);

    if (rc != NGX_OK && (of->err == 0 || !of->errors)) {
        goto failed;
    }

create:

    if (cache->current >= cache->max) {
        ngx_expire_old_cached_files(cache, 0, pool->log);
    }

    file = ngx_alloc(sizeof(ngx_cached_open_file_t), pool->log);

    if (file == NULL) {
        goto failed;
    }

    file->name = ngx_alloc(name->len + 1, pool->log);

    if (file->name == NULL) {
        ngx_free(file);
        file = NULL;
        goto failed;
    }

    ngx_cpystrn(file->name, name->data, name->len + 1);

    file->node.key = hash;

    ngx_rbtree_insert(&cache->rbtree, &file->node);

    cache->current++;

    file->uses = 1;
    file->count = 0;
    file->use_event = 0;
    file->event = NULL;

add_event:

    ngx_open_file_add_event(cache, file, of, pool->log);

update:

    file->fd = of->fd;
    file->err = of->err;
#if (NGX_HAVE_OPENAT)
    file->disable_symlinks = of->disable_symlinks;
    file->disable_symlinks_from = of->disable_symlinks_from;
#endif

    if (of->err == 0) {
        file->uniq = of->uniq;
        file->mtime = of->mtime;
        file->size = of->size;

        file->close = 0;

        file->is_dir = of->is_dir;
        file->is_file = of->is_file;
        file->is_link = of->is_link;
        file->is_exec = of->is_exec;
        file->is_directio = of->is_directio;

        if (!of->is_dir) {
            file->count++;
        }
    }

    file->created = now;

found:

    file->accessed = now;

    ngx_queue_insert_head(&cache->expire_queue, &file->queue);

    ngx_log_debug5(NGX_LOG_DEBUG_CORE, pool->log, 0,
                   "cached open file: %s, fd:%d, c:%d, e:%d, u:%d",
                   file->name, file->fd, file->count, file->err, file->uses);

    if (of->err == 0) {

        if (!of->is_dir) {
            cln->handler = ngx_open_file_cleanup;
            ofcln = cln->data;

            ofcln->cache = cache;
            ofcln->file = file;
            ofcln->min_uses = of->min_uses;
            ofcln->log = pool->log;
        }

        return NGX_OK;
    }

    return NGX_ERROR;

failed:

    if (file) {
        ngx_rbtree_delete(&cache->rbtree, &file->node);

        cache->current--;

        if (file->count == 0) {

            if (file->fd != NGX_INVALID_FILE) {
                if (ngx_close_file(file->fd) == NGX_FILE_ERROR) {
                    ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                                  ngx_close_file_n " \"%s\" failed",
                                  file->name);
                }
            }

            ngx_free(file->name);
            ngx_free(file);

        } else {
            file->close = 1;
        }
    }

    if (of->fd != NGX_INVALID_FILE) {
        if (ngx_close_file(of->fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, pool->log, ngx_errno,
                          ngx_close_file_n " \"%V\" failed", name);
        }
    }

    return NGX_ERROR;
}